

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O1

void final_check(artifact *art,object *obj)

{
  _Bool *p_Var1;
  _Bool *p_Var2;
  activation **ppaVar3;
  bitflag *flags_00;
  _Bool _Var4;
  short sVar5;
  int iVar6;
  long lVar7;
  _Bool **pp_Var8;
  effect_object_property *p;
  bool bVar9;
  element_info *el_info;
  element_info *peVar10;
  int *piVar11;
  int16_t *piVar12;
  ulong uVar13;
  _Bool **pp_Var14;
  effect_object_property *peVar15;
  bool bVar16;
  bitflag *flags;
  wchar_t unsummarized_count;
  int local_54;
  int local_34;
  
  flags_00 = obj->flags;
  piVar12 = obj->modifiers;
  if (art != (artifact *)0x0) {
    piVar12 = art->modifiers;
    flags_00 = art->flags;
  }
  uVar13 = 0;
  do {
    if ((uVar13 < 5) && (piVar12[uVar13] < 0)) {
      flag_off(flags_00,6,(int)uVar13 + 1);
    }
    if (uVar13 != 9) {
      sVar5 = piVar12[uVar13];
      if (5 < sVar5) {
        sVar5 = 6;
      }
      piVar12[uVar13] = sVar5;
    }
    uVar13 = uVar13 + 1;
  } while (uVar13 != 0x11);
  peVar10 = art->el_info;
  if (art == (artifact *)0x0) {
    peVar10 = obj->el_info;
  }
  lVar7 = 0;
  do {
    if (peVar10[lVar7].res_level < 100) {
      peVar10[lVar7].flags = peVar10[lVar7].flags | 2;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if ((0 < piVar12[5]) && (_Var4 = flag_has_dbg(flags_00,6,0x1e,"flags","OF_AGGRAVATE"), _Var4)) {
    piVar12[5] = 0;
  }
  if ((0 < piVar12[0xd]) && (_Var4 = flag_has_dbg(flags_00,6,0x2b,"flags","OF_DARKNESS"), _Var4)) {
    piVar12[0xd] = 0;
  }
  ppaVar3 = &obj->activation;
  pp_Var8 = &obj->brands;
  if (art != (artifact *)0x0) {
    pp_Var8 = &art->brands;
    ppaVar3 = &art->activation;
  }
  pp_Var14 = &obj->slays;
  if (art != (artifact *)0x0) {
    pp_Var14 = &art->slays;
  }
  if (*ppaVar3 != (activation *)0x0) {
    p_Var1 = *pp_Var8;
    p_Var2 = *pp_Var14;
    p = effect_summarize_properties((*ppaVar3)->effect,&local_34);
    if (local_34 < 1) {
      if (p == (effect_object_property *)0x0) {
        return;
      }
      peVar15 = p;
      bVar16 = true;
      do {
        bVar9 = false;
        switch(peVar15->kind) {
        case EFPROP_OBJECT_FLAG_EXACT:
        case EFPROP_CURE_FLAG:
        case EFPROP_CONFLICT_FLAG:
          _Var4 = flag_has_dbg(flags_00,6,peVar15->idx,"flags","pcurr->idx");
          bVar9 = bVar16;
          if (!_Var4) {
            bVar9 = false;
          }
          break;
        case EFPROP_RESIST:
        case EFPROP_CONFLICT_RESIST:
        case EFPROP_CONFLICT_VULN:
          bVar9 = bVar16;
          if ((peVar15->reslevel_min <= (int)peVar10[peVar15->idx].res_level) &&
             ((int)peVar10[peVar15->idx].res_level <= peVar15->reslevel_max)) {
            bVar9 = false;
          }
          break;
        case EFPROP_BRAND:
          bVar9 = bVar16;
          if (p_Var1 != (_Bool *)0x0) {
            iVar6 = 1;
            if (1 < (ulong)z_info->brand_max) {
              piVar11 = &brands[1].multiplier;
              iVar6 = 1;
              uVar13 = 1;
              do {
                if (((p_Var1[uVar13] == true) && (piVar11[-2] == brands[peVar15->idx].resist_flag))
                   && (iVar6 < *piVar11)) {
                  iVar6 = *piVar11;
                }
                uVar13 = uVar13 + 1;
                piVar11 = piVar11 + 0xc;
              } while (z_info->brand_max != uVar13);
            }
            if (iVar6 < brands[peVar15->idx].multiplier) {
              bVar9 = false;
            }
          }
          break;
        case EFPROP_SLAY:
          bVar9 = bVar16;
          if (p_Var2 != (_Bool *)0x0) {
            local_54 = 1;
            if (1 < z_info->slay_max) {
              local_54 = 1;
              uVar13 = 1;
              lVar7 = 100;
              do {
                if (((p_Var2[uVar13] == true) &&
                    (_Var4 = same_monsters_slain((wchar_t)uVar13,peVar15->idx), _Var4)) &&
                   (iVar6 = *(int *)((long)&slays->code + lVar7), local_54 < iVar6)) {
                  local_54 = iVar6;
                }
                uVar13 = uVar13 + 1;
                lVar7 = lVar7 + 0x38;
              } while (uVar13 < z_info->slay_max);
            }
            if (local_54 < slays[peVar15->idx].multiplier) {
              bVar9 = false;
            }
          }
        }
        peVar15 = peVar15->next;
      } while ((peVar15 != (effect_object_property *)0x0) && (bVar16 = bVar9, bVar9));
    }
    while (p != (effect_object_property *)0x0) {
      peVar15 = p->next;
      mem_free(p);
      p = peVar15;
    }
  }
  return;
}

Assistant:

static void final_check(struct artifact *art, struct object *obj)
{
	bitflag *flags = art ? art->flags : obj->flags;
	int16_t *modifiers = art ? art->modifiers : obj->modifiers;
	struct element_info *el_info = art ? art->el_info : obj->el_info;
	int i;

	/* Limit modifiers, remove sustains if a stat modifier is negative */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if ((i < STAT_MAX) && (modifiers[i] < 0)) {
			of_off(flags, i + 1);
		}
		if (i != OBJ_MOD_SPEED) {
			modifiers[i] = MIN(modifiers[i], 6);
		}
	}

	/* Low resist means object is proof against that element */
	for (i = 0; i < ELEM_BASE_MAX; i++) {
		if (el_info[i].res_level < RES_LEVEL_BASE) {
			el_info[i].flags |= EL_INFO_IGNORE;
		}
	}

	/* Remove contradictory properties */
	if ((modifiers[OBJ_MOD_STEALTH] > 0) && of_has(flags, OF_AGGRAVATE)) {
		modifiers[OBJ_MOD_STEALTH] = 0;
	}
	if ((modifiers[OBJ_MOD_LIGHT] > 0) && of_has(flags, OF_DARKNESS)) {
		modifiers[OBJ_MOD_LIGHT] = 0;
	}
	remove_contradictory_activation(art, obj);
}